

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_ce22::BlockCopy<sptk::uint24_t>::Run
          (BlockCopy<sptk::uint24_t> *this,istream *input_stream)

{
  uint write_size;
  int iVar1;
  bool bVar2;
  bool bVar3;
  char *__nptr;
  bool bVar4;
  bool bVar5;
  uint write_size_00;
  uint uVar6;
  int *piVar7;
  undefined8 uVar8;
  ostream *poVar9;
  uint8_t *puVar10;
  long lVar11;
  uint uVar12;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string word;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> pad_data;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> input_data;
  char *local_b8;
  long local_b0;
  char local_a8 [16];
  uint8_t *local_98;
  uint8_t *local_90;
  uint8_t *local_88;
  ulong local_80;
  long local_78;
  long local_70;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> local_68;
  char *local_50;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> local_48;
  
  uVar12 = this->input_end_number_ - this->input_start_number_;
  write_size = this->output_start_number_;
  write_size_00 = (~uVar12 - write_size) + this->output_block_length_;
  uVar6 = write_size_00;
  if ((int)write_size_00 < (int)write_size) {
    uVar6 = write_size;
  }
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
            (&local_68,(long)(int)uVar6,&this->pad_value_,(allocator_type *)&local_b8);
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
            (&local_48,(long)this->input_block_length_,(allocator_type *)&local_b8);
  if (this->is_ascii_ == false) {
    while (bVar4 = sptk::ReadStream<sptk::uint24_t>
                             (false,0,0,this->input_block_length_,&local_48,input_stream,(int *)0x0)
          , bVar4) {
      if ((((0 < (int)write_size) &&
           (bVar5 = sptk::WriteStream<sptk::uint24_t>
                              (0,write_size,&local_68,(ostream *)&std::cout,(int *)0x0), !bVar5)) ||
          (bVar5 = sptk::WriteStream<sptk::uint24_t>
                             (this->input_start_number_,uVar12 + 1,&local_48,(ostream *)&std::cout,
                              (int *)0x0), !bVar5)) ||
         ((0 < (int)write_size_00 &&
          (bVar5 = sptk::WriteStream<sptk::uint24_t>
                             (0,write_size_00,&local_68,(ostream *)&std::cout,(int *)0x0), !bVar5)))
         ) break;
    }
    bVar4 = !bVar4;
  }
  else {
    local_78 = (long)(int)write_size_00;
    local_88 = (local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl
                .super__Vector_impl_data._M_start)->value + 2;
    local_98 = (local_68.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl
                .super__Vector_impl_data._M_start)->value + 1;
    local_70 = (ulong)write_size * 3;
    local_90 = (local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl
                .super__Vector_impl_data._M_start)->value + 1;
    bVar5 = false;
    local_80 = (ulong)write_size;
    while (bVar4 = true, !bVar5) {
      if (0 < this->input_block_length_) {
        lVar11 = 0;
        puVar10 = local_88;
        do {
          local_b8 = local_a8;
          local_b0 = 0;
          local_a8[0] = '\0';
          std::operator>>(input_stream,(string *)&local_b8);
          __nptr = local_b8;
          bVar3 = false;
          if (local_b0 == 0) {
            bVar3 = true;
            bVar5 = true;
            bVar2 = false;
          }
          else {
            bVar2 = true;
            if ((this->input_start_number_ <= lVar11) && (lVar11 <= this->input_end_number_)) {
              piVar7 = __errno_location();
              iVar1 = *piVar7;
              *piVar7 = 0;
              strtold(__nptr,&local_50);
              if (local_50 == __nptr) {
                uVar8 = std::__throw_invalid_argument("stold");
LAB_00107f3d:
                if (local_b8 != local_a8) {
                  operator_delete(local_b8);
                }
                if (local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.
                                  super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_68.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_68.
                                  super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                _Unwind_Resume(uVar8);
              }
              if (*piVar7 == 0) {
                *piVar7 = iVar1;
              }
              else if (*piVar7 == 0x22) {
                uVar8 = std::__throw_out_of_range("stold");
                goto LAB_00107f3d;
              }
              iVar1 = (int)ROUND(in_ST0);
              ((uint24_t *)(puVar10 + -2))->value[0] = (uint8_t)iVar1;
              puVar10[-1] = (uint8_t)((uint)iVar1 >> 8);
              *puVar10 = (uint8_t)((uint)iVar1 >> 0x10);
              bVar3 = false;
              in_ST0 = in_ST1;
              in_ST1 = in_ST2;
              in_ST2 = in_ST3;
              in_ST3 = in_ST4;
              in_ST4 = in_ST5;
              in_ST5 = in_ST6;
              in_ST6 = in_ST7;
            }
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8);
          }
          if (!bVar2) {
            if (!bVar3) {
              bVar4 = true;
              if (bVar3) {
                bVar4 = false;
              }
              goto LAB_00107eec;
            }
            break;
          }
          lVar11 = lVar11 + 1;
          puVar10 = puVar10 + 3;
        } while (lVar11 < this->input_block_length_);
      }
      puVar10 = local_98;
      if (bVar5) break;
      if (0 < (int)local_80) {
        lVar11 = 0;
        do {
          poVar9 = (ostream *)
                   std::ostream::operator<<
                             (&std::cout,
                              (uint)CONCAT21(*(undefined2 *)(puVar10 + lVar11),puVar10[lVar11 + -1])
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          lVar11 = lVar11 + 3;
        } while (local_70 != lVar11);
      }
      iVar1 = this->input_start_number_;
      if (iVar1 <= this->input_end_number_) {
        lVar11 = (long)iVar1 + -1;
        puVar10 = local_90 + (long)iVar1 * 3;
        do {
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18))
               = 0x13;
          poVar9 = (ostream *)
                   std::ostream::operator<<
                             (&std::cout,
                              (uint)CONCAT21(*(undefined2 *)puVar10,
                                             ((uint24_t *)(puVar10 + -1))->value[0]));
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          lVar11 = lVar11 + 1;
          puVar10 = puVar10 + 3;
        } while (lVar11 < this->input_end_number_);
      }
      if (0 < (int)write_size_00) {
        lVar11 = 0;
        puVar10 = local_98;
        do {
          poVar9 = (ostream *)
                   std::ostream::operator<<
                             (&std::cout,
                              (uint)CONCAT21(*(undefined2 *)puVar10,
                                             ((uint24_t *)(puVar10 + -1))->value[0]));
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          lVar11 = lVar11 + 1;
          puVar10 = puVar10 + 3;
        } while (lVar11 < local_78);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
    }
  }
LAB_00107eec:
  if (local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    const int copy_length(input_end_number_ - input_start_number_ + 1);
    const int left_pad_length(output_start_number_);
    const int right_pad_length(output_block_length_ - output_start_number_ -
                               copy_length);

    std::vector<T> pad_data(std::max(left_pad_length, right_pad_length),
                            pad_value_);
    std::vector<T> input_data(input_block_length_);

    if (is_ascii_) {
      T* pads(&(pad_data[0]));
      T* inputs(&(input_data[0]));
      bool halt(false);
      while (!halt) {
        // Read data.
        for (int i(0); i < input_block_length_; ++i) {
          std::string word;
          *input_stream >> word;
          if (word.empty()) {
            halt = true;
            break;
          }
          if (input_start_number_ <= i && i <= input_end_number_) {
            try {
              inputs[i] = static_cast<T>(std::stold(word));
            } catch (std::invalid_argument&) {
              return false;
            }
          }
        }
        if (halt) break;

        // Write data.
        for (int i(0); i < left_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        for (int i(input_start_number_); i <= input_end_number_; ++i) {
          std::cout << std::setprecision(
                           std::numeric_limits<long double>::digits10 + 1)
                    << inputs[i] << " ";
        }
        for (int i(0); i < right_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        std::cout << std::endl;
      }
    } else {
      while (sptk::ReadStream(false, 0, 0, input_block_length_, &input_data,
                              input_stream, NULL)) {
        if (0 < left_pad_length &&
            !sptk::WriteStream(0, left_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
        if (!sptk::WriteStream(input_start_number_, copy_length, input_data,
                               &std::cout, NULL)) {
          return false;
        }
        if (0 < right_pad_length &&
            !sptk::WriteStream(0, right_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
      }
    }

    return true;
  }